

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef find_kinit(jit_State *J,BCIns *endpc,BCReg slot,IRType t)

{
  GCproto *pGVar1;
  uint uVar2;
  uint uVar3;
  byte bVar5;
  int k;
  TRef TVar4;
  long lVar6;
  ulong uVar7;
  BCIns *pBVar8;
  BCIns *pBVar9;
  double dVar10;
  
  pGVar1 = J->pt + 1;
  pBVar9 = endpc;
  do {
    while( true ) {
      pBVar8 = pBVar9;
      pBVar9 = pBVar8 + -1;
      if (pBVar9 <= pGVar1) {
        return 0;
      }
      uVar2 = *pBVar9;
      bVar5 = (byte)(uVar2 >> 8);
      if ((lj_bc_mode[(byte)uVar2] & 7) == 1) break;
      if (((lj_bc_mode[(byte)uVar2] & 7) == 2) && (bVar5 <= slot)) {
        return 0;
      }
    }
  } while (bVar5 != slot);
  if (1 < (uVar2 & 0xff) - 0x29) {
    return 0;
  }
  for (lVar6 = -4; pGVar1 < (GCproto *)((long)pBVar8 + lVar6); lVar6 = lVar6 + -4) {
    uVar3 = (((GCproto *)((long)pBVar8 + lVar6))->nextgc).gcptr32;
    if (((char)uVar3 == 'X') &&
       (uVar7 = (ulong)(uVar3 >> 0xe & 0x3fffc),
       (BCIns *)((long)pBVar8 + lVar6 + uVar7 + -0x1fffc) <= endpc &&
       -8 < (long)(uVar7 + lVar6 + -0x20000))) {
      return 0;
    }
  }
  if ((uVar2 & 0xff) == 0x29) {
    k = (int)uVar2 >> 0x10;
    if (t == IRT_IGC) {
LAB_00140289:
      TVar4 = lj_ir_kint(J,k);
      return TVar4;
    }
    dVar10 = (double)k;
  }
  else {
    uVar7 = (ulong)(J->pt->k).ptr32;
    if (t == IRT_IGC) {
      dVar10 = *(double *)(uVar7 + (ulong)(uVar2 >> 0x10) * 8);
      if (dVar10 != (double)(int)dVar10) {
        return 0;
      }
      if (NAN(dVar10) || NAN((double)(int)dVar10)) {
        return 0;
      }
      k = (int)dVar10;
      goto LAB_00140289;
    }
    dVar10 = *(double *)(uVar7 + (ulong)(uVar2 >> 0x10) * 8);
  }
  TVar4 = lj_ir_knum_u64(J,(uint64_t)dVar10);
  return TVar4;
}

Assistant:

static TRef find_kinit(jit_State *J, const BCIns *endpc, BCReg slot, IRType t)
{
  /* This algorithm is rather simplistic and assumes quite a bit about
  ** how the bytecode is generated. It works fine for FORI initializers,
  ** but it won't necessarily work in other cases (e.g. iterator arguments).
  ** It doesn't do anything fancy, either (like backpropagating MOVs).
  */
  const BCIns *pc, *startpc = proto_bc(J->pt);
  for (pc = endpc-1; pc > startpc; pc--) {
    BCIns ins = *pc;
    BCOp op = bc_op(ins);
    /* First try to find the last instruction that stores to this slot. */
    if (bcmode_a(op) == BCMbase && bc_a(ins) <= slot) {
      return 0;  /* Multiple results, e.g. from a CALL or KNIL. */
    } else if (bcmode_a(op) == BCMdst && bc_a(ins) == slot) {
      if (op == BC_KSHORT || op == BC_KNUM) {  /* Found const. initializer. */
	/* Now try to verify there's no forward jump across it. */
	const BCIns *kpc = pc;
	for (; pc > startpc; pc--)
	  if (bc_op(*pc) == BC_JMP) {
	    const BCIns *target = pc+bc_j(*pc)+1;
	    if (target > kpc && target <= endpc)
	      return 0;  /* Conditional assignment. */
	  }
	if (op == BC_KSHORT) {
	  int32_t k = (int32_t)(int16_t)bc_d(ins);
	  return t == IRT_INT ? lj_ir_kint(J, k) : lj_ir_knum(J, (lua_Number)k);
	} else {
	  cTValue *tv = proto_knumtv(J->pt, bc_d(ins));
	  if (t == IRT_INT) {
	    int32_t k = numberVint(tv);
	    if (tvisint(tv) || numV(tv) == (lua_Number)k)  /* -0 is ok here. */
	      return lj_ir_kint(J, k);
	    return 0;  /* Type mismatch. */
	  } else {
	    return lj_ir_knum(J, numberVnum(tv));
	  }
	}
      }
      return 0;  /* Non-constant initializer. */
    }
  }
  return 0;  /* No assignment to this slot found? */
}